

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvAdvDiff_bnd.c
# Opt level: O0

int main(void)

{
  int iVar1;
  undefined8 uVar2;
  N_Vector u_00;
  undefined8 uVar3;
  void *cvode_mem_00;
  SUNProfiler profobj;
  SUNContext sunctx;
  long nst;
  int retval;
  int iout;
  void *cvode_mem;
  SUNLinearSolver LS;
  SUNMatrix A;
  UserData data;
  N_Vector u;
  sunrealtype umax;
  sunrealtype tout;
  sunrealtype t;
  sunrealtype abstol;
  sunrealtype reltol;
  sunrealtype dy;
  sunrealtype dx;
  SUNContext in_stack_ffffffffffffff78;
  sunrealtype reltol_00;
  undefined1 local_78 [8];
  undefined4 local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 local_60;
  UserData data_00;
  double local_38;
  undefined1 local_30 [8];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  data_00 = (UserData)0x0;
  local_60 = 0;
  local_68 = 0;
  reltol_00 = 0.0;
  local_70 = SUNContext_Create(0,&stack0xffffffffffffff80);
  iVar1 = check_retval(SUB84(reltol_00,0),(char *)in_stack_ffffffffffffff78);
  if (iVar1 == 0) {
    SUNContext_PopErrHandler(reltol_00);
    SUNContext_PushErrHandler(reltol_00,SUNAbortErrHandlerFn,0);
    SUNContext_PushErrHandler(reltol_00,SUNLogErrHandlerFn,0);
    local_70 = SUNContext_GetProfiler(reltol_00,&stack0xffffffffffffff78);
    iVar1 = check_retval(SUB84(reltol_00,0),(char *)in_stack_ffffffffffffff78);
    if (iVar1 == 0) {
      uVar2 = N_VNew_Serial(0x32,reltol_00);
      SUNContext_GetLastError(reltol_00);
      iVar1 = check_retval(SUB84(reltol_00,0),(char *)in_stack_ffffffffffffff78);
      if (iVar1 == 0) {
        local_20 = 0;
        local_28 = 0x3ee4f8b588e368f1;
        u_00 = (N_Vector)malloc(0x30);
        if (u_00 == (N_Vector)0x0) {
          fprintf(_stderr,"MEMORY_ERROR: malloc failed - returned NULL pointer\n");
          local_4 = 1;
        }
        else {
          u_00->content = (void *)0x3fc745d1745d1746;
          local_10 = 0x3fc745d1745d1746;
          u_00->ops = (N_Vector_Ops)0x3fc5555555555555;
          local_18 = 0x3fc5555555555555;
          u_00->sunctx = (SUNContext)0x403e400000000000;
          u_00[1].content = (void *)0x3ff6000000000000;
          u_00[1].ops = (N_Vector_Ops)0x4042000000000000;
          u_00[1].sunctx = in_stack_ffffffffffffff78;
          SetIC(u_00,data_00);
          local_68 = CVodeCreate(2,reltol_00);
          SUNContext_GetLastError(reltol_00);
          iVar1 = check_retval(SUB84(reltol_00,0),(char *)in_stack_ffffffffffffff78);
          if (iVar1 == 0) {
            local_70 = CVodeInit(0,local_68,f,uVar2);
            iVar1 = check_retval(SUB84(reltol_00,0),(char *)in_stack_ffffffffffffff78);
            if (iVar1 == 0) {
              local_70 = CVodeSStolerances(local_20,local_28,local_68);
              iVar1 = check_retval(SUB84(reltol_00,0),(char *)in_stack_ffffffffffffff78);
              if (iVar1 == 0) {
                local_70 = CVodeSetUserData(local_68,u_00);
                iVar1 = check_retval(SUB84(reltol_00,0),(char *)in_stack_ffffffffffffff78);
                if (iVar1 == 0) {
                  uVar3 = SUNBandMatrix(0x32,5,5,reltol_00);
                  SUNContext_GetLastError(reltol_00);
                  iVar1 = check_retval(SUB84(reltol_00,0),(char *)in_stack_ffffffffffffff78);
                  if (iVar1 == 0) {
                    local_60 = SUNLinSol_Band(uVar2,uVar3,reltol_00);
                    SUNContext_GetLastError(reltol_00);
                    iVar1 = check_retval(SUB84(reltol_00,0),(char *)in_stack_ffffffffffffff78);
                    if (iVar1 == 0) {
                      local_70 = CVodeSetLinearSolver(local_68,local_60,uVar3);
                      iVar1 = check_retval(SUB84(reltol_00,0),(char *)in_stack_ffffffffffffff78);
                      if (iVar1 == 0) {
                        local_70 = CVodeSetJacFn(local_68,Jac);
                        iVar1 = check_retval(SUB84(reltol_00,0),(char *)in_stack_ffffffffffffff78);
                        if (iVar1 == 0) {
                          cvode_mem_00 = (void *)N_VMaxNorm(uVar2);
                          PrintHeader(reltol_00,(sunrealtype)in_stack_ffffffffffffff78,
                                      5.23104848241212e-318);
                          local_38 = 0.1;
                          for (local_6c = 1; local_6c < 0xb; local_6c = local_6c + 1) {
                            local_70 = CVode(local_38,local_68,uVar2,local_30,1);
                            iVar1 = check_retval(SUB84(reltol_00,0),
                                                 (char *)in_stack_ffffffffffffff78);
                            if (iVar1 != 0) break;
                            cvode_mem_00 = (void *)N_VMaxNorm(uVar2);
                            local_70 = CVodeGetNumSteps(local_68,local_78);
                            check_retval(SUB84(reltol_00,0),(char *)in_stack_ffffffffffffff78);
                            PrintOutput(reltol_00,(sunrealtype)in_stack_ffffffffffffff78,0x10287c);
                            local_38 = local_38 + 0.1;
                          }
                          PrintFinalStats(cvode_mem_00);
                          N_VDestroy(uVar2);
                          CVodeFree(&local_68);
                          SUNLinSolFree(local_60);
                          SUNMatDestroy(uVar3);
                          free(u_00);
                          SUNContext_Free(&stack0xffffffffffffff80);
                          local_4 = 0;
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  sunrealtype dx, dy, reltol, abstol, t, tout, umax;
  N_Vector u;
  UserData data;
  SUNMatrix A;
  SUNLinearSolver LS;
  void* cvode_mem;
  int iout, retval;
  long int nst;
  SUNContext sunctx;
  SUNProfiler profobj;

  /* Initialize variables */
  u         = NULL;
  data      = NULL;
  A         = NULL;
  LS        = NULL;
  cvode_mem = NULL;
  sunctx    = NULL;

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(retval, "SUNContext_Create")) { return (1); }

  /* Setup different error handler stack so that we abort after logging */
  SUNContext_PopErrHandler(sunctx);
  SUNContext_PushErrHandler(sunctx, SUNAbortErrHandlerFn, NULL);
  SUNContext_PushErrHandler(sunctx, SUNLogErrHandlerFn, NULL);

  /* Get a reference to the profiler */
  retval = SUNContext_GetProfiler(sunctx, &profobj);
  if (check_retval(retval, "SUNContext_GetProfiler")) { return (1); }

  SUNDIALS_MARK_FUNCTION_BEGIN(profobj);

  /* Create a serial vector */

  u = N_VNew_Serial(NEQ, sunctx); /* Allocate u vector */
  if (check_retval(SUNContext_GetLastError(sunctx), "N_VNew_Serial"))
  {
    return (1);
  }

  reltol = ZERO; /* Set the tolerances */
  abstol = ATOL;

  data = (UserData)malloc(sizeof *data); /* Allocate data memory */
  if (!data)
  {
    fprintf(stderr, "MEMORY_ERROR: malloc failed - returned NULL pointer\n");
    return 1;
  }

  dx = data->dx = XMAX / (MX + 1); /* Set grid coefficients in data */
  dy = data->dy = YMAX / (MY + 1);
  data->hdcoef  = ONE / (dx * dx);
  data->hacoef  = HALF / (TWO * dx);
  data->vdcoef  = ONE / (dy * dy);
  data->profobj = profobj;

  SUNDIALS_MARK_BEGIN(profobj, "Setup");

  SetIC(u, data); /* Initialize u vector */

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */

  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval(SUNContext_GetLastError(sunctx), "CVodeCreate"))
  {
    return (1);
  }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in u'=f(t,u), the inital time T0, and
   * the initial dependent variable vector u. */
  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(retval, "CVodeInit")) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative tolerance
   * and scalar absolute tolerance */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(retval, "CVodeSStolerances")) { return (1); }

  /* Set the pointer to user-defined data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(retval, "CVodeSetUserData")) { return (1); }

  /* Create banded SUNMatrix for use in linear solves -- since this will be factored,
     set the storage bandwidth to be the sum of upper and lower bandwidths */
  A = SUNBandMatrix(NEQ, MY, MY, sunctx);
  if (check_retval(SUNContext_GetLastError(sunctx), "SUNBandMatrix"))
  {
    return (1);
  }

  /* Create banded SUNLinearSolver object for use by CVode */
  LS = SUNLinSol_Band(u, A, sunctx);
  if (check_retval(SUNContext_GetLastError(sunctx), "SUNLinSol_Band"))
  {
    return (1);
  }

  /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(retval, "CVodeSetLinearSolver")) { return (1); }

  /* Set the user-supplied Jacobian routine Jac */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(retval, "CVodeSetJacFn")) { return (1); }

  SUNDIALS_MARK_END(profobj, "Setup");

  /* In loop over output points: call CVode, print results, test for errors */

  SUNDIALS_MARK_BEGIN(profobj, "Integration loop");
  umax = N_VMaxNorm(u);
  PrintHeader(reltol, abstol, umax);
  for (iout = 1, tout = T1; iout <= NOUT; iout++, tout += DTOUT)
  {
    retval = CVode(cvode_mem, tout, u, &t, CV_NORMAL);
    if (check_retval(retval, "CVode")) { break; }
    umax   = N_VMaxNorm(u);
    retval = CVodeGetNumSteps(cvode_mem, &nst);
    check_retval(retval, "CVodeGetNumSteps");
    PrintOutput(t, umax, nst);
  }
  SUNDIALS_MARK_END(profobj, "Integration loop");
  PrintFinalStats(cvode_mem); /* Print some final statistics   */

  N_VDestroy(u);         /* Free the u vector          */
  CVodeFree(&cvode_mem); /* Free the integrator memory */
  SUNLinSolFree(LS);     /* Free linear solver memory  */
  SUNMatDestroy(A);      /* Free the matrix memory     */
  free(data);            /* Free the user data         */

  SUNDIALS_MARK_FUNCTION_END(profobj);
  SUNContext_Free(&sunctx);
  return (0);
}